

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QUrl __thiscall QVariant::toUrl(QVariant *this)

{
  QUrlPrivate *in_RDI;
  QVariant *in_stack_00000028;
  
  qvariant_cast<QUrl>(in_stack_00000028);
  return (QUrl)in_RDI;
}

Assistant:

QUrl QVariant::toUrl() const
{
    return qvariant_cast<QUrl>(*this);
}